

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.h
# Opt level: O2

void __thiscall
google::protobuf::UnknownFieldSet::InternalMergeFrom(UnknownFieldSet *this,UnknownFieldSet *other)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  UnknownField *__x;
  long lVar2;
  uint uVar3;
  
  pvVar1 = other->fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     (uVar3 = (uint)((ulong)((long)(pvVar1->
                                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pvVar1->
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 4), 0 < (int)uVar3)
     ) {
    pvVar1 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              *)operator_new(0x18);
    (pvVar1->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar1->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar1->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->fields_ = pvVar1;
    for (lVar2 = 0; (ulong)(uVar3 & 0x7fffffff) << 4 != lVar2; lVar2 = lVar2 + 0x10) {
      __x = (UnknownField *)
            ((long)&((other->fields_->
                     super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                     )._M_impl.super__Vector_impl_data._M_start)->number_ + lVar2);
      std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
      push_back(this->fields_,__x);
      UnknownField::DeepCopy
                ((this->fields_->
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 )._M_impl.super__Vector_impl_data._M_finish + -1,__x);
    }
  }
  return;
}

Assistant:

inline int UnknownFieldSet::field_count() const {
  return fields_ ? static_cast<int>(fields_->size()) : 0;
}